

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::changeRowDualLower(HPresolve *this,HighsInt row,double newLower)

{
  double oldVarLower;
  pointer pdVar1;
  iterator __end1;
  iterator __begin1;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  int local_90;
  iterator local_88;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> local_48;
  
  pdVar1 = (this->rowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  oldVarLower = pdVar1[row];
  pdVar1[row] = newLower;
  local_48.nodeValue =
       (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.nodeIndex =
       (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_48.nodeLeft =
       (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_48.nodeRight =
       (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start;
  local_48.root =
       (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[row];
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(&local_88,&local_48);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = -1;
  while (local_88.currentNode != local_90) {
    HighsLinearSumBounds::updatedVarLower
              (&this->impliedDualRowBounds,*local_88.pos_.index_,row,*local_88.pos_.value_,
               oldVarLower);
    markChangedCol(this,*local_88.pos_.index_);
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_88);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_88.stack.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void HPresolve::changeRowDualLower(HighsInt row, double newLower) {
  double oldLower = rowDualLower[row];
  rowDualLower[row] = newLower;
  // printf("tightening lower bound of column %" HIGHSINT_FORMAT " from %.15g to
  // %.15g\n", col,
  //        oldLower, newLower);

  for (const HighsSliceNonzero& nonzero : getRowVector(row)) {
    impliedDualRowBounds.updatedVarLower(nonzero.index(), row, nonzero.value(),
                                         oldLower);
    markChangedCol(nonzero.index());
  }
}